

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O1

SpatialBinSplit<16UL> * __thiscall
embree::sse2::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int dim;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar24;
  uint uVar25;
  undefined1 auVar23 [16];
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  float fVar42;
  undefined1 auVar43 [16];
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  int aiStack_808 [4];
  float afStack_7f8 [64];
  uint auStack_6f8 [284];
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [5] [16];
  float afStack_1f8 [64];
  uint auStack_f8 [50];
  int aiStack_30 [12];
  
  paVar6 = &this->bounds[0xf][2].upper.field_0;
  iVar14 = 0;
  iVar16 = 0;
  iVar18 = 0;
  iVar20 = 0;
  lVar9 = 0x7f0;
  auVar12 = _DAT_01feb9f0;
  auVar13 = _DAT_01feba00;
  auVar23 = _DAT_01feba00;
  auVar27 = _DAT_01feb9f0;
  auVar28 = _DAT_01feba00;
  auVar29 = _DAT_01feb9f0;
  do {
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar9);
    iVar14 = iVar14 + *piVar1;
    iVar16 = iVar16 + piVar1[1];
    iVar18 = iVar18 + piVar1[2];
    iVar20 = iVar20 + piVar1[3];
    *(int *)((long)aiStack_808 + lVar9) = iVar14;
    *(int *)((long)aiStack_808 + lVar9 + 4) = iVar16;
    *(int *)((long)aiStack_808 + lVar9 + 8) = iVar18;
    *(int *)((long)aiStack_808 + lVar9 + 0xc) = iVar20;
    auVar12 = minps(auVar12,(undefined1  [16])paVar6[-5]);
    auVar13 = maxps(auVar13,(undefined1  [16])paVar6[-4]);
    fVar30 = auVar13._4_4_ - auVar12._4_4_;
    fVar31 = auVar13._8_4_ - auVar12._8_4_;
    auVar27 = minps(auVar27,(undefined1  [16])paVar6[-3]);
    auVar23 = maxps(auVar23,(undefined1  [16])paVar6[-2]);
    fVar32 = auVar23._4_4_ - auVar27._4_4_;
    fVar33 = auVar23._8_4_ - auVar27._8_4_;
    *(ulong *)((long)&uStack_908 + lVar9) =
         CONCAT44((auVar23._0_4_ - auVar27._0_4_) * (fVar32 + fVar33) + fVar33 * fVar32,
                  (auVar13._0_4_ - auVar12._0_4_) * (fVar30 + fVar31) + fVar31 * fVar30);
    auVar29 = minps(auVar29,(undefined1  [16])paVar6[-1]);
    auVar28 = maxps(auVar28,(undefined1  [16])*paVar6);
    fVar30 = auVar28._4_4_ - auVar29._4_4_;
    fVar31 = auVar28._8_4_ - auVar29._8_4_;
    *(float *)((long)afStack_900 + lVar9) =
         (fVar30 + fVar31) * (auVar28._0_4_ - auVar29._0_4_) + fVar31 * fVar30;
    *(undefined4 *)((long)afStack_900 + lVar9 + 4) = 0;
    lVar9 = lVar9 + -0x10;
    paVar6 = paVar6 + -6;
  } while (lVar9 != 0x700);
  uVar7 = 0xffffffff;
  uVar8 = ~(-1 << ((byte)blocks_shift & 0x1f));
  local_248[0] = _DAT_01feb9f0;
  uVar15 = 0;
  uVar17 = 0;
  uVar19 = 0;
  uVar21 = 0;
  local_288 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  uVar35 = 1;
  uVar37 = 1;
  uVar39 = 1;
  uVar41 = 1;
  lVar9 = 0x50;
  lVar10 = 0x600;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  local_288._8_4_ = 0;
  local_288._12_4_ = 0;
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  local_258._8_4_ = 0;
  local_258._12_4_ = 0;
  local_268._0_4_ = 0;
  local_268._4_4_ = 0;
  local_268._8_4_ = 0;
  local_268._12_4_ = 0;
  auVar12 = _DAT_01feba00;
  auVar13 = _DAT_01feba00;
  auVar23 = _DAT_01feb9f0;
  auVar27 = _DAT_01feba00;
  auVar28 = _DAT_01feb9f0;
  auVar29 = _DAT_01feb9f0;
  do {
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar10);
    uVar15 = uVar15 + *piVar1;
    uVar17 = uVar17 + piVar1[1];
    uVar19 = uVar19 + piVar1[2];
    uVar21 = uVar21 + piVar1[3];
    auVar23 = minps(auVar23,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar9));
    auVar13 = maxps(auVar13,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar9));
    local_278 = auVar13._0_4_;
    fStack_274 = auVar13._4_4_;
    fStack_270 = auVar13._8_4_;
    fStack_274 = fStack_274 - auVar23._4_4_;
    fStack_270 = fStack_270 - auVar23._8_4_;
    auVar28 = minps(auVar28,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar9));
    auVar12 = maxps(auVar12,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar9));
    fVar30 = auVar12._4_4_ - auVar28._4_4_;
    fVar31 = auVar12._8_4_ - auVar28._8_4_;
    auVar29 = minps(auVar29,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar9));
    auVar27 = maxps(auVar27,*(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar9))
    ;
    fVar32 = auVar27._0_4_ - auVar29._0_4_;
    fVar33 = auVar27._4_4_ - auVar29._4_4_;
    fVar42 = auVar27._8_4_ - auVar29._8_4_;
    uVar11 = blocks_shift & 0xffffffff;
    uVar22 = uVar15 + uVar8 >> uVar11;
    uVar24 = uVar17 + uVar8 >> uVar11;
    uVar25 = uVar19 + uVar8 >> uVar11;
    uVar26 = uVar21 + uVar8 >> uVar11;
    uVar2 = *(uint *)((long)auStack_6f8 + lVar10 + 4);
    uVar3 = *(uint *)((long)auStack_6f8 + lVar10 + 8);
    uVar4 = *(uint *)((long)auStack_6f8 + lVar10 + 0xc);
    uVar34 = uVar8 + *(uint *)((long)auStack_6f8 + lVar10) >> uVar11;
    uVar36 = uVar8 + uVar2 >> uVar11;
    uVar38 = uVar8 + uVar3 >> uVar11;
    uVar40 = uVar8 + uVar4 >> uVar11;
    auVar43._0_4_ =
         ((float)(uVar34 & 0x7fffffff) + (float)((int)uVar34 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar10) +
         ((float)(uVar22 & 0x7fffffff) + (float)((int)uVar22 >> 0x1f & 0x4f000000)) *
         ((local_278 - auVar23._0_4_) * (fStack_274 + fStack_270) + fStack_270 * fStack_274);
    auVar43._4_4_ =
         ((float)(uVar36 & 0x7fffffff) + (float)((int)uVar36 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar10 + 4) +
         ((float)(uVar24 & 0x7fffffff) + (float)((int)uVar24 >> 0x1f & 0x4f000000)) *
         ((auVar12._0_4_ - auVar28._0_4_) * (fVar30 + fVar31) + fVar31 * fVar30);
    auVar43._8_4_ =
         ((float)(uVar38 & 0x7fffffff) + (float)((int)uVar38 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar10 + 8) +
         ((float)(uVar25 & 0x7fffffff) + (float)((int)uVar25 >> 0x1f & 0x4f000000)) *
         (fVar32 * (fVar42 + fVar33) + fVar33 * fVar42);
    auVar43._12_4_ =
         ((float)(uVar40 & 0x7fffffff) + (float)((int)uVar40 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar10 + 0xc) +
         ((float)(uVar26 & 0x7fffffff) + (float)((int)uVar26 >> 0x1f & 0x4f000000)) *
         (fVar32 * (fVar33 + fVar42) + fVar42 * fVar33);
    uVar22 = -(uint)(local_248[0]._0_4_ <= auVar43._0_4_);
    uVar24 = -(uint)(local_248[0]._4_4_ <= auVar43._4_4_);
    uVar25 = -(uint)(local_248[0]._8_4_ <= auVar43._8_4_);
    uVar26 = -(uint)(local_248[0]._12_4_ <= auVar43._12_4_);
    local_288._0_4_ = local_288._0_4_ & uVar22 | ~uVar22 & uVar35;
    local_288._4_4_ = local_288._4_4_ & uVar24 | ~uVar24 & uVar37;
    local_288._8_4_ = local_288._8_4_ & uVar25 | ~uVar25 & uVar39;
    local_288._12_4_ = local_288._12_4_ & uVar26 | ~uVar26 & uVar41;
    local_248[0] = minps(auVar43,local_248[0]);
    local_258._0_4_ = local_258._0_4_ & uVar22 | ~uVar22 & uVar15;
    local_258._4_4_ = local_258._4_4_ & uVar24 | ~uVar24 & uVar17;
    local_258._8_4_ = local_258._8_4_ & uVar25 | ~uVar25 & uVar19;
    local_258._12_4_ = local_258._12_4_ & uVar26 | ~uVar26 & uVar21;
    local_268._0_4_ = ~uVar22 & *(uint *)((long)auStack_6f8 + lVar10) | local_268._0_4_ & uVar22;
    local_268._4_4_ = ~uVar24 & uVar2 | local_268._4_4_ & uVar24;
    local_268._8_4_ = ~uVar25 & uVar3 | local_268._8_4_ & uVar25;
    local_268._12_4_ = ~uVar26 & uVar4 | local_268._12_4_ & uVar26;
    uVar35 = uVar35 + 1;
    uVar37 = uVar37 + 1;
    uVar39 = uVar39 + 1;
    uVar41 = uVar41 + 1;
    lVar9 = lVar9 + 0x60;
    lVar10 = lVar10 + 0x10;
  } while (lVar9 != 0x5f0);
  fVar30 = INFINITY;
  uVar11 = 0;
  iVar16 = 0;
  iVar14 = 0;
  iVar18 = 0;
  do {
    fVar31 = (mapping->scale).field_0.v[uVar11];
    if ((((fVar31 != 0.0) || (NAN(fVar31))) && (afStack_1f8[uVar11 - 0x14] < fVar30)) &&
       (*(int *)(local_288 + uVar11 * 4) != 0)) {
      iVar14 = *(int *)(local_258 + uVar11 * 4);
      iVar16 = *(int *)(local_268 + uVar11 * 4);
      uVar7 = uVar11 & 0xffffffff;
      iVar18 = *(int *)(local_288 + uVar11 * 4);
      fVar30 = afStack_1f8[uVar11 - 0x14];
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  if ((int)uVar7 == -1) {
    fVar30 = INFINITY;
    iVar16 = -1;
    iVar14 = -1;
    iVar18 = 0;
  }
  __return_storage_ptr__->sah = fVar30;
  __return_storage_ptr__->dim = (int)uVar7;
  __return_storage_ptr__->pos = iVar18;
  __return_storage_ptr__->left = iVar14;
  __return_storage_ptr__->right = iVar16;
  __return_storage_ptr__->factor = 1.0;
  uVar5 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 =
       *(undefined8 *)&(mapping->ofs).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar5;
  uVar5 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 =
       *(undefined8 *)&(mapping->scale).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar5;
  uVar5 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 =
       *(undefined8 *)&(mapping->inv_scale).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar5;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }